

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O3

void __thiscall QPageRanges::addRange(QPageRanges *this,int from,int to)

{
  QPageRangesPrivate *pQVar1;
  QList<QPageRanges::Range> *this_00;
  int iVar2;
  long in_FS_OFFSET;
  Range local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((from < 1) || (to < 1)) {
    addRange();
  }
  else {
    iVar2 = from;
    if ((uint)to < (uint)from) {
      iVar2 = to;
    }
    if ((uint)from < (uint)to) {
      from = to;
    }
    detach(this);
    pQVar1 = (this->d).d.ptr;
    this_00 = &pQVar1->intervals;
    local_30.from = iVar2;
    local_30.to = from;
    QtPrivate::QMovableArrayOps<QPageRanges::Range>::emplace<QPageRanges::Range>
              ((QMovableArrayOps<QPageRanges::Range> *)this_00,(pQVar1->intervals).d.size,&local_30)
    ;
    QList<QPageRanges::Range>::end(this_00);
    QPageRangesPrivate::mergeIntervals((this->d).d.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageRanges::addRange(int from, int to)
{
    if (from <= 0 || to <= 0) {
        qWarning("QPageRanges::addRange: 'from' and 'to' must be greater than 0");
        return;
    }
    if (to < from)
        std::swap(from, to);

    detach();
    d->intervals.append({from, to});
    d->mergeIntervals();
}